

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DLM.cpp
# Opt level: O1

void __thiscall
OpenMD::DLM::rotateStep(DLM *this,int axes1,int axes2,RealType angle,Vector3d *ji,RotMat3x3d *A)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  ulong uVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  double (*padVar8) [3];
  double (*padVar9) [3];
  uint k;
  long lVar10;
  double dVar11;
  double dVar12;
  uint uVar13;
  SquareMatrix<double,_3> m;
  RotMat3x3d rot;
  double local_b8 [10];
  double local_68 [9];
  
  pdVar4 = local_b8;
  local_b8[6] = 0.0;
  local_b8[7] = 0.0;
  local_b8[4] = 0.0;
  local_b8[5] = 0.0;
  local_b8[2] = 0.0;
  local_b8[3] = 0.0;
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  local_b8[8] = 0.0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      uVar13 = 0x3ff00000;
      if (lVar5 != lVar6) {
        uVar13 = 0;
      }
      pdVar4[lVar6] = (double)((ulong)uVar13 << 0x20);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    lVar5 = lVar5 + 1;
    pdVar4 = pdVar4 + 3;
  } while (lVar5 != 3);
  lVar5 = 0;
  do {
    *(undefined8 *)((long)local_68 + lVar5 + 0x10) = *(undefined8 *)((long)local_b8 + lVar5 + 0x10);
    uVar2 = *(undefined8 *)((long)local_b8 + lVar5 + 8);
    *(undefined8 *)((long)local_68 + lVar5) = *(undefined8 *)((long)local_b8 + lVar5);
    *(undefined8 *)((long)local_68 + lVar5 + 8) = uVar2;
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x48);
  dVar11 = cos(angle);
  dVar12 = sin(angle);
  uVar3 = (ulong)(uint)axes1;
  local_68[uVar3 * 4] = dVar11;
  uVar7 = (ulong)(uint)axes2;
  local_68[uVar7 * 4] = dVar11;
  local_68[uVar3 * 3 + uVar7] = dVar12;
  local_68[uVar7 * 3 + uVar3] = -dVar12;
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  local_b8[2] = 0.0;
  pdVar4 = local_68;
  lVar5 = 0;
  do {
    dVar11 = local_b8[lVar5];
    lVar6 = 0;
    do {
      dVar11 = dVar11 + pdVar4[lVar6] * (ji->super_Vector<double,_3U>).data_[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    local_b8[lVar5] = dVar11;
    lVar5 = lVar5 + 1;
    pdVar4 = pdVar4 + 3;
  } while (lVar5 != 3);
  (ji->super_Vector<double,_3U>).data_[2] = local_b8[2];
  (ji->super_Vector<double,_3U>).data_[0] = local_b8[0];
  (ji->super_Vector<double,_3U>).data_[1] = local_b8[1];
  local_b8[6] = 0.0;
  local_b8[7] = 0.0;
  local_b8[4] = 0.0;
  local_b8[5] = 0.0;
  local_b8[2] = 0.0;
  local_b8[3] = 0.0;
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  local_b8[8] = 0.0;
  pdVar4 = local_68;
  lVar5 = 0;
  do {
    lVar6 = 0;
    padVar8 = (double (*) [3])A;
    do {
      dVar11 = local_b8[lVar5 * 3 + lVar6];
      lVar10 = 0;
      padVar9 = padVar8;
      do {
        dVar11 = dVar11 + pdVar4[lVar10] *
                          (((SquareMatrix<double,_3> *)*padVar9)->super_RectMatrix<double,_3U,_3U>).
                          data_[0][0];
        lVar10 = lVar10 + 1;
        padVar9 = padVar9 + 1;
      } while (lVar10 != 3);
      local_b8[lVar5 * 3 + lVar6] = dVar11;
      lVar6 = lVar6 + 1;
      padVar8 = (double (*) [3])(*padVar8 + 1);
    } while (lVar6 != 3);
    lVar5 = lVar5 + 1;
    pdVar4 = pdVar4 + 3;
  } while (lVar5 != 3);
  lVar5 = 0;
  do {
    *(undefined8 *)
     ((long)(A->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
     lVar5 + 0x10) = *(undefined8 *)((long)local_b8 + lVar5 + 0x10);
    uVar2 = *(undefined8 *)((long)local_b8 + lVar5 + 8);
    puVar1 = (undefined8 *)
             ((long)(A->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
             lVar5);
    *puVar1 = *(undefined8 *)((long)local_b8 + lVar5);
    puVar1[1] = uVar2;
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x48);
  return;
}

Assistant:

void DLM::rotateStep(int axes1, int axes2, RealType angle, Vector3d& ji,
                       RotMat3x3d& A) {
    RealType sinAngle;
    RealType cosAngle;
    // RealType angleSqr;
    // RealType angleSqrOver4;
    // RealType top, bottom;

    RotMat3x3d tempA(A);  // initialize the tempA
    Vector3d tempJ(0.0);

    RotMat3x3d rot = RotMat3x3d::identity();  // initalize rot as a unit matrix

    // use a small angle aproximation for sin and cosine

    // angleSqr = angle * angle;
    // angleSqrOver4 = angleSqr / 4.0;
    // top = 1.0 - angleSqrOver4;
    // bottom = 1.0 + angleSqrOver4;

    // cosAngle = top / bottom;
    // sinAngle = angle / bottom;

    // or don't use the small angle approximation:
    cosAngle          = cos(angle);
    sinAngle          = sin(angle);
    rot(axes1, axes1) = cosAngle;
    rot(axes2, axes2) = cosAngle;

    rot(axes1, axes2) = sinAngle;
    rot(axes2, axes1) = -sinAngle;

    // rotate the momentum acoording to: ji[] = rot[][] * ji[]
    ji = rot * ji;

    // This code comes from converting an algorithm detailed in
    // J. Chem. Phys. 107 (15), pp. 5840-5851 by Dullweber,
    // Leimkuhler and McLachlan (DLM) for use in our code.
    // In Appendix A, the DLM paper has the change to the rotation
    // matrix as: Q = Q * rot.transpose(), but our rotation matrix
    // A is actually equivalent to Q.transpose(). This fact can be
    // seen on page 5849 of the DLM paper where a lab frame
    // dipole \mu_i(t) is expressed in terms of a body-fixed
    // reference orientation, \bar{\mu_i} and the rotation matrix, Q:
    //  \mu_i(t) = Q * \bar{\mu_i}
    // Our code computes lab frame vectors from body-fixed reference
    // vectors using:
    //   v_{lab} = A.transpose() * v_{body}
    //  (See StuntDouble.hpp for confirmation of this fact).
    //
    // So, using the identity:
    //  (A * B).transpose() = B.transpose() * A.transpose(),  we
    // get the equivalent of Q = Q * rot.transpose() for our code to be:

    A = rot * A;
  }